

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O1

void cppwinrt::write_open_file_guard(writer *w,string_view *file_name,char impl)

{
  size_t sVar1;
  size_t sVar2;
  string mangled_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string_view local_40;
  
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)&(w->super_writer_base<cppwinrt::writer>).m_first,
             (w->super_writer_base<cppwinrt::writer>).m_first.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish,"#pragma once\n","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  sVar1 = file_name->_M_len;
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      std::__cxx11::string::push_back((char)&local_60);
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  if (impl != '\0') {
    std::__cxx11::string::push_back((char)&local_60);
    std::__cxx11::string::push_back((char)&local_60);
  }
  local_40._M_len = 0x24;
  local_40._M_str = "#ifndef WINRT_%_H\n#define WINRT_%_H\n";
  writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string,std::__cxx11::string>
            (&w->super_writer_base<cppwinrt::writer>,&local_40,&local_60,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void write_open_file_guard(writer& w, std::string_view const& file_name, char impl = 0)
    {
        write_include_guard(w);
            
        std::string mangled_name;

        for (auto&& c : file_name)
        {
            mangled_name += c == '.' ? '_' : c;
        }

        if (impl)
        {
            mangled_name += '_';
            mangled_name += impl;
        }

        auto format = R"(#ifndef WINRT_%_H
#define WINRT_%_H
)";

        w.write(format, mangled_name, mangled_name);
    }